

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

int tinyfd_messageBox(char *aTitle,char *aMessage,char *aDialogType,char *aIconType,
                     int aDefaultButton)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  FILE *__stream;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  uint local_58c;
  speed_t local_588;
  bool local_582;
  bool local_581;
  char *local_580;
  char *local_570;
  char *local_560;
  size_t local_4f8;
  size_t local_4f0;
  size_t lMessageLen;
  size_t lTitleLen;
  termios info;
  termios infoOri;
  char lChar;
  int lResult;
  int lWasXterm;
  int lWasGraphicDialog;
  FILE *lIn;
  char *lpDialogString;
  char *lDialogString;
  char lBuff [1024];
  int aDefaultButton_local;
  char *aIconType_local;
  char *aDialogType_local;
  char *aMessage_local;
  char *aTitle_local;
  
  lpDialogString = (char *)0x0;
  bVar7 = false;
  bVar6 = false;
  lDialogString._0_1_ = '\0';
  lBuff._1020_4_ = aDefaultButton;
  if (aTitle == (char *)0x0) {
    local_4f0 = 0;
  }
  else {
    local_4f0 = strlen(aTitle);
  }
  if (aMessage == (char *)0x0) {
    local_4f8 = 0;
  }
  else {
    local_4f8 = strlen(aMessage);
  }
  if ((aTitle == (char *)0x0) || (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 != 0)) {
    lpDialogString = (char *)malloc(local_4f0 + 0x400 + local_4f8);
  }
  iVar2 = osascriptPresent();
  if (iVar2 == 0) {
    iVar2 = kdialogPresent();
    if (iVar2 == 0) {
      iVar2 = zenityPresent();
      if ((((iVar2 == 0) && (iVar2 = matedialogPresent(), iVar2 == 0)) &&
          (iVar2 = shellementaryPresent(), iVar2 == 0)) && (iVar2 = qarmaPresent(), iVar2 == 0)) {
        iVar2 = gxmessagePresent();
        if (((iVar2 == 0) && (iVar2 = gmessagePresent(), iVar2 == 0)) &&
           ((iVar2 = gdialogPresent(), iVar2 == 0 &&
            ((iVar2 = xdialogPresent(), iVar2 == 0 && (iVar2 = tkinter2Present(), iVar2 != 0)))))) {
          if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
            strcpy(tinyfd_response,"python2-tkinter");
            return 1;
          }
          strcpy(lpDialogString,gPython2Name);
          iVar2 = isTerminalRunning();
          if ((iVar2 == 0) && (iVar2 = isDarwin(), iVar2 != 0)) {
            strcat(lpDialogString," -i");
          }
          strcat(lpDialogString,
                 " -S -c \"import Tkinter,tkMessageBox;root=Tkinter.Tk();root.withdraw();");
          iVar2 = isDarwin();
          if (iVar2 != 0) {
            strcat(lpDialogString,
                   "import os;os.system(\'\'\'/usr/bin/osascript -e \'tell app \\\"Finder\\\" to set frontmost of process \\\"Python\\\" to true\' \'\'\');"
                  );
          }
          strcat(lpDialogString,"res=tkMessageBox.");
          if ((aDialogType == (char *)0x0) || (iVar2 = strcmp("okcancel",aDialogType), iVar2 != 0))
          {
            if ((aDialogType == (char *)0x0) || (iVar2 = strcmp("yesno",aDialogType), iVar2 != 0)) {
              if ((aDialogType == (char *)0x0) ||
                 (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 != 0)) {
                strcat(lpDialogString,"showinfo(");
              }
              else {
                strcat(lpDialogString,"askyesnocancel(");
                if (lBuff._1020_4_ == 0) {
                  strcat(lpDialogString,"default=tkMessageBox.CANCEL,");
                }
                else if (lBuff._1020_4_ == 1) {
                  strcat(lpDialogString,"default=tkMessageBox.YES,");
                }
                else if (lBuff._1020_4_ == 2) {
                  strcat(lpDialogString,"default=tkMessageBox.NO,");
                }
              }
            }
            else {
              strcat(lpDialogString,"askyesno(");
              if (lBuff._1020_4_ == 0) {
                strcat(lpDialogString,"default=tkMessageBox.NO,");
              }
              else {
                strcat(lpDialogString,"default=tkMessageBox.YES,");
              }
            }
          }
          else {
            strcat(lpDialogString,"askokcancel(");
            if (lBuff._1020_4_ == 0) {
              strcat(lpDialogString,"default=tkMessageBox.CANCEL,");
            }
            else {
              strcat(lpDialogString,"default=tkMessageBox.OK,");
            }
          }
          strcat(lpDialogString,"icon=\'");
          if ((aIconType == (char *)0x0) ||
             (((iVar2 = strcmp("question",aIconType), iVar2 != 0 &&
               (iVar2 = strcmp("error",aIconType), iVar2 != 0)) &&
              (iVar2 = strcmp("warning",aIconType), iVar2 != 0)))) {
            strcat(lpDialogString,"info");
          }
          else {
            strcat(lpDialogString,aIconType);
          }
          strcat(lpDialogString,"\',");
          if ((aTitle != (char *)0x0) && (sVar3 = strlen(aTitle), sVar3 != 0)) {
            strcat(lpDialogString,"title=\'");
            strcat(lpDialogString,aTitle);
            strcat(lpDialogString,"\',");
          }
          if ((aMessage != (char *)0x0) && (sVar3 = strlen(aMessage), sVar3 != 0)) {
            strcat(lpDialogString,"message=\'");
            pcVar5 = lpDialogString;
            sVar3 = strlen(lpDialogString);
            replaceSubStr(aMessage,"\n","\\n",pcVar5 + sVar3);
            strcat(lpDialogString,"\'");
          }
          if ((aDialogType == (char *)0x0) ||
             (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 != 0)) {
            strcat(lpDialogString,");\nif res is False :\n\tprint 0\nelse :\n\tprint 1\n\"");
          }
          else {
            strcat(lpDialogString,
                   ");\nif res is None :\n\tprint 0\nelif res is False :\n\tprint 2\nelse :\n\tprint 1\n\""
                  );
          }
        }
        else {
          iVar2 = gxmessagePresent();
          if ((iVar2 == 0) &&
             ((((iVar2 = gmessagePresent(), iVar2 == 0 && (iVar2 = gdialogPresent(), iVar2 == 0)) &&
               (iVar2 = xdialogPresent(), iVar2 == 0)) && (iVar2 = tkinter3Present(), iVar2 != 0))))
          {
            if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
              strcpy(tinyfd_response,"python3-tkinter");
              return 1;
            }
            strcpy(lpDialogString,gPython3Name);
            strcat(lpDialogString,
                   " -S -c \"import tkinter;from tkinter import messagebox;root=tkinter.Tk();root.withdraw();"
                  );
            strcat(lpDialogString,"res=messagebox.");
            if ((aDialogType == (char *)0x0) || (iVar2 = strcmp("okcancel",aDialogType), iVar2 != 0)
               ) {
              if ((aDialogType == (char *)0x0) || (iVar2 = strcmp("yesno",aDialogType), iVar2 != 0))
              {
                if ((aDialogType == (char *)0x0) ||
                   (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 != 0)) {
                  strcat(lpDialogString,"showinfo(");
                }
                else {
                  strcat(lpDialogString,"askyesnocancel(");
                  if (lBuff._1020_4_ == 0) {
                    strcat(lpDialogString,"default=messagebox.CANCEL,");
                  }
                  else if (lBuff._1020_4_ == 1) {
                    strcat(lpDialogString,"default=messagebox.YES,");
                  }
                  else if (lBuff._1020_4_ == 2) {
                    strcat(lpDialogString,"default=messagebox.NO,");
                  }
                }
              }
              else {
                strcat(lpDialogString,"askyesno(");
                if (lBuff._1020_4_ == 0) {
                  strcat(lpDialogString,"default=messagebox.NO,");
                }
                else {
                  strcat(lpDialogString,"default=messagebox.YES,");
                }
              }
            }
            else {
              strcat(lpDialogString,"askokcancel(");
              if (lBuff._1020_4_ == 0) {
                strcat(lpDialogString,"default=messagebox.CANCEL,");
              }
              else {
                strcat(lpDialogString,"default=messagebox.OK,");
              }
            }
            strcat(lpDialogString,"icon=\'");
            if ((aIconType == (char *)0x0) ||
               (((iVar2 = strcmp("question",aIconType), iVar2 != 0 &&
                 (iVar2 = strcmp("error",aIconType), iVar2 != 0)) &&
                (iVar2 = strcmp("warning",aIconType), iVar2 != 0)))) {
              strcat(lpDialogString,"info");
            }
            else {
              strcat(lpDialogString,aIconType);
            }
            strcat(lpDialogString,"\',");
            if ((aTitle != (char *)0x0) && (sVar3 = strlen(aTitle), sVar3 != 0)) {
              strcat(lpDialogString,"title=\'");
              strcat(lpDialogString,aTitle);
              strcat(lpDialogString,"\',");
            }
            if ((aMessage != (char *)0x0) && (sVar3 = strlen(aMessage), sVar3 != 0)) {
              strcat(lpDialogString,"message=\'");
              pcVar5 = lpDialogString;
              sVar3 = strlen(lpDialogString);
              replaceSubStr(aMessage,"\n","\\n",pcVar5 + sVar3);
              strcat(lpDialogString,"\'");
            }
            if ((aDialogType == (char *)0x0) ||
               (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 != 0)) {
              strcat(lpDialogString,");\nif res is False :\n\tprint(0)\nelse :\n\tprint(1)\n\"");
            }
            else {
              strcat(lpDialogString,
                     ");\nif res is None :\n\tprint(0)\nelif res is False :\n\tprint(2)\nelse :\n\tprint 1\n\""
                    );
            }
          }
          else {
            iVar2 = gxmessagePresent();
            if (((iVar2 == 0) && (iVar2 = gmessagePresent(), iVar2 == 0)) &&
               ((iVar2 = gdialogPresent(), iVar2 != 0 ||
                ((iVar2 = xdialogPresent(), iVar2 != 0 || (iVar2 = xmessagePresent(), iVar2 == 0))))
               )) {
              iVar2 = xdialogPresent();
              if ((((iVar2 == 0) && (iVar2 = gdialogPresent(), iVar2 == 0)) &&
                  (pcVar5 = dialogName(), pcVar5 == (char *)0x0)) &&
                 (iVar2 = whiptailPresent(), iVar2 == 0)) {
                iVar2 = isTerminalRunning();
                if ((iVar2 == 0) && (pcVar5 = terminalName(), pcVar5 != (char *)0x0)) {
                  if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)
                     ) {
                    strcpy(tinyfd_response,"basicinput");
                    return 0;
                  }
                  pcVar5 = lpDialogString;
                  pcVar4 = terminalName();
                  strcpy(pcVar5,pcVar4);
                  strcat(lpDialogString,"\'");
                  if ((gWarningDisplayed == 0) && (tinyfd_forceConsole == 0)) {
                    gWarningDisplayed = 1;
                    strcat(lpDialogString,"echo \"");
                    strcat(lpDialogString,"missing software! (we will try basic console input)");
                    strcat(lpDialogString,"\";");
                    strcat(lpDialogString,"echo \"");
                    strcat(lpDialogString,
                           " ___________\n/           \\ \n| tiny file |\n|  dialogs  |\n\\_____  ____/\n      \\|\ntiny file dialogs on UNIX needs:\n   applescript\nor kdialog\nor zenity (or matedialog or qarma)\nor python (2 or 3)\n + tkinter + python-dbus (optional)\nor dialog (opens console if needed)\nor xterm + bash\n   (opens console for basic input)\nor existing console for basic input"
                          );
                    strcat(lpDialogString,"\";echo;echo;");
                  }
                  if ((aTitle != (char *)0x0) && (sVar3 = strlen(aTitle), sVar3 != 0)) {
                    strcat(lpDialogString,"echo \"");
                    strcat(lpDialogString,aTitle);
                    strcat(lpDialogString,"\";echo;");
                  }
                  if ((aMessage != (char *)0x0) && (sVar3 = strlen(aMessage), sVar3 != 0)) {
                    strcat(lpDialogString,"echo \"");
                    strcat(lpDialogString,aMessage);
                    strcat(lpDialogString,"\"; ");
                  }
                  if ((aDialogType == (char *)0x0) ||
                     (iVar2 = strcmp("yesno",aDialogType), iVar2 != 0)) {
                    if ((aDialogType == (char *)0x0) ||
                       (iVar2 = strcmp("okcancel",aDialogType), iVar2 != 0)) {
                      if ((aDialogType == (char *)0x0) ||
                         (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 != 0)) {
                        strcat(lpDialogString,"echo -n \"press enter to continue \"; ");
                        strcat(lpDialogString,"stty sane -echo;");
                        strcat(lpDialogString,"answer=$( while ! head -c 1;do true ;done);echo 1");
                      }
                      else {
                        strcat(lpDialogString,"echo -n \"[Y]es/[N]o/[C]ancel: \"; ");
                        strcat(lpDialogString,"stty sane -echo;");
                        strcat(lpDialogString,
                               "answer=$( while ! head -c 1 | grep -i [nyc];do true ;done);");
                        strcat(lpDialogString,
                               "if echo \"$answer\" | grep -iq \"^y\";then\n\techo 1\n");
                        strcat(lpDialogString,
                               "elif echo \"$answer\" | grep -iq \"^n\";then\n\techo 2\n");
                        strcat(lpDialogString,"else\n\techo 0\nfi");
                      }
                    }
                    else {
                      strcat(lpDialogString,"echo -n \"[O]kay/[C]ancel: \"; ");
                      strcat(lpDialogString,"stty sane -echo;");
                      strcat(lpDialogString,
                             "answer=$( while ! head -c 1 | grep -i [oc];do true ;done);");
                      strcat(lpDialogString,"if echo \"$answer\" | grep -iq \"^o\";then\n");
                      strcat(lpDialogString,"\techo 1\nelse\n\techo 0\nfi");
                    }
                  }
                  else {
                    strcat(lpDialogString,"echo -n \"y/n: \"; ");
                    strcat(lpDialogString,"stty sane -echo;");
                    strcat(lpDialogString,
                           "answer=$( while ! head -c 1 | grep -i [ny];do true ;done);");
                    strcat(lpDialogString,"if echo \"$answer\" | grep -iq \"^y\";then\n");
                    strcat(lpDialogString,"\techo 1\nelse\n\techo 0\nfi");
                  }
                  strcat(lpDialogString," >/tmp/tinyfd.txt\';cat /tmp/tinyfd.txt;rm /tmp/tinyfd.txt"
                        );
                }
                else {
                  iVar2 = isTerminalRunning();
                  if ((iVar2 == 0) &&
                     ((iVar2 = pythonDbusPresent(), iVar2 != 0 &&
                      (iVar2 = strcmp("ok",aDialogType), iVar2 == 0)))) {
                    if ((aTitle != (char *)0x0) &&
                       (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
                      strcpy(tinyfd_response,"python-dbus");
                      return 1;
                    }
                    strcpy(lpDialogString,gPythonName);
                    strcat(lpDialogString," -c \"import dbus;bus=dbus.SessionBus();");
                    strcat(lpDialogString,
                           "notif=bus.get_object(\'org.freedesktop.Notifications\',\'/org/freedesktop/Notifications\');"
                          );
                    strcat(lpDialogString,
                           "notify=dbus.Interface(notif,\'org.freedesktop.Notifications\');");
                    strcat(lpDialogString,"notify.Notify(\'\',0,\'");
                    if ((aIconType != (char *)0x0) && (sVar3 = strlen(aIconType), sVar3 != 0)) {
                      strcat(lpDialogString,aIconType);
                    }
                    strcat(lpDialogString,"\',\'");
                    if ((aTitle != (char *)0x0) && (sVar3 = strlen(aTitle), sVar3 != 0)) {
                      strcat(lpDialogString,aTitle);
                    }
                    strcat(lpDialogString,"\',\'");
                    if ((aMessage != (char *)0x0) &&
                       (sVar3 = strlen(aMessage), pcVar5 = lpDialogString, sVar3 != 0)) {
                      sVar3 = strlen(lpDialogString);
                      replaceSubStr(aMessage,"\n","\\n",pcVar5 + sVar3);
                    }
                    strcat(lpDialogString,"\',\'\',\'\',5000)\"");
                  }
                  else {
                    iVar2 = isTerminalRunning();
                    if ((iVar2 == 0) &&
                       ((iVar2 = perlPresent(), 1 < iVar2 &&
                        (iVar2 = strcmp("ok",aDialogType), iVar2 == 0)))) {
                      if ((aTitle != (char *)0x0) &&
                         (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
                        strcpy(tinyfd_response,"perl-dbus");
                        return 1;
                      }
                      local_560 = aIconType;
                      if (aIconType == (char *)0x0) {
                        local_560 = "";
                      }
                      local_570 = aTitle;
                      if (aTitle == (char *)0x0) {
                        local_570 = "";
                      }
                      local_580 = aMessage;
                      if (aMessage == (char *)0x0) {
                        local_580 = "";
                      }
                      sprintf(lpDialogString,
                              "perl -e \"use Net::DBus;                                                                 my \\$sessionBus = Net::DBus->session;                                                                 my \\$notificationsService = \\$sessionBus->get_service(\'org.freedesktop.Notifications\');                                                                 my \\$notificationsObject = \\$notificationsService->get_object(\'/org/freedesktop/Notifications\',                                                                 \'org.freedesktop.Notifications\');                                                                 my \\$notificationId;\\$notificationId = \\$notificationsObject->Notify(shift, 0, \'%s\', \'%s\', \'%s\', [], {}, -1);\" "
                              ,local_560,local_570,local_580);
                    }
                    else {
                      iVar2 = isTerminalRunning();
                      if ((iVar2 != 0) ||
                         ((iVar2 = notifysendPresent(), iVar2 == 0 ||
                          (iVar2 = strcmp("ok",aDialogType), iVar2 != 0)))) {
                        if ((aTitle != (char *)0x0) &&
                           (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
                          strcpy(tinyfd_response,"basicinput");
                          return 0;
                        }
                        if ((gWarningDisplayed == 0) && (tinyfd_forceConsole == 0)) {
                          gWarningDisplayed = 1;
                          printf("\n\n%s\n","missing software! (we will try basic console input)");
                          printf("%s\n\n",
                                 " ___________\n/           \\ \n| tiny file |\n|  dialogs  |\n\\_____  ____/\n      \\|\ntiny file dialogs on UNIX needs:\n   applescript\nor kdialog\nor zenity (or matedialog or qarma)\nor python (2 or 3)\n + tkinter + python-dbus (optional)\nor dialog (opens console if needed)\nor xterm + bash\n   (opens console for basic input)\nor existing console for basic input"
                                );
                        }
                        if ((aTitle != (char *)0x0) && (sVar3 = strlen(aTitle), sVar3 != 0)) {
                          printf("\n%s\n",aTitle);
                        }
                        tcgetattr(0,(termios *)&info.c_ispeed);
                        tcgetattr(0,(termios *)&lTitleLen);
                        info.c_oflag = info.c_oflag & 0xfffffffd;
                        info.c_lflag._3_1_ = 1;
                        info.c_lflag._2_1_ = 0;
                        tcsetattr(0,0,(termios *)&lTitleLen);
                        if ((aDialogType == (char *)0x0) ||
                           (iVar2 = strcmp("yesno",aDialogType), iVar2 != 0)) {
                          if ((aDialogType == (char *)0x0) ||
                             (iVar2 = strcmp("okcancel",aDialogType), iVar2 != 0)) {
                            if ((aDialogType == (char *)0x0) ||
                               (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 != 0)) {
                              if ((aMessage != (char *)0x0) &&
                                 (sVar3 = strlen(aMessage), sVar3 != 0)) {
                                printf("\n%s\n\n");
                              }
                              printf("press enter to continue ");
                              fflush(_stdout);
                              getchar();
                              printf("\n\n");
                              infoOri.c_ospeed = 1;
                            }
                            else {
                              do {
                                if ((aMessage != (char *)0x0) &&
                                   (sVar3 = strlen(aMessage), sVar3 != 0)) {
                                  printf("\n%s\n");
                                }
                                printf("[Y]es/[N]o/[C]ancel: ");
                                fflush(_stdout);
                                iVar2 = getchar();
                                iVar2 = tolower(iVar2);
                                cVar1 = (char)iVar2;
                                printf("\n\n");
                                bVar7 = false;
                                if ((cVar1 != 'y') && (bVar7 = false, cVar1 != 'n')) {
                                  bVar7 = cVar1 != 'c';
                                }
                              } while (bVar7);
                              if (cVar1 == 'y') {
                                local_588 = 1;
                              }
                              else {
                                local_588 = 0;
                                if (cVar1 == 'n') {
                                  local_588 = 2;
                                }
                              }
                              infoOri.c_ospeed = local_588;
                            }
                          }
                          else {
                            do {
                              if ((aMessage != (char *)0x0) &&
                                 (sVar3 = strlen(aMessage), sVar3 != 0)) {
                                printf("\n%s\n");
                              }
                              printf("[O]kay/[C]ancel: ");
                              fflush(_stdout);
                              iVar2 = getchar();
                              iVar2 = tolower(iVar2);
                              cVar1 = (char)iVar2;
                              printf("\n\n");
                              local_582 = cVar1 != 'o' && cVar1 != 'c';
                            } while (local_582);
                            infoOri.c_ospeed = (speed_t)(cVar1 == 'o');
                          }
                        }
                        else {
                          do {
                            if ((aMessage != (char *)0x0) && (sVar3 = strlen(aMessage), sVar3 != 0))
                            {
                              printf("\n%s\n");
                            }
                            printf("y/n: ");
                            fflush(_stdout);
                            iVar2 = getchar();
                            iVar2 = tolower(iVar2);
                            cVar1 = (char)iVar2;
                            printf("\n\n");
                            local_581 = cVar1 != 'y' && cVar1 != 'n';
                          } while (local_581);
                          infoOri.c_ospeed = (speed_t)(cVar1 == 'y');
                        }
                        tcsetattr(0,0,(termios *)&info.c_ispeed);
                        free(lpDialogString);
                        return infoOri.c_ospeed;
                      }
                      if ((aTitle != (char *)0x0) &&
                         (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
                        strcpy(tinyfd_response,"notifysend");
                        return 1;
                      }
                      strcpy(lpDialogString,"notify-send");
                      if ((aIconType != (char *)0x0) && (sVar3 = strlen(aIconType), sVar3 != 0)) {
                        strcat(lpDialogString," -i \'");
                        strcat(lpDialogString,aIconType);
                        strcat(lpDialogString,"\'");
                      }
                      strcat(lpDialogString," \"");
                      if ((aTitle != (char *)0x0) && (sVar3 = strlen(aTitle), sVar3 != 0)) {
                        strcat(lpDialogString,aTitle);
                        strcat(lpDialogString," | ");
                      }
                      if ((aMessage != (char *)0x0) && (sVar3 = strlen(aMessage), sVar3 != 0)) {
                        replaceSubStr(aMessage,"\n\t"," |  ",(char *)&lDialogString);
                        replaceSubStr(aMessage,"\n"," | ",(char *)&lDialogString);
                        replaceSubStr(aMessage,"\t","  ",(char *)&lDialogString);
                        strcat(lpDialogString,(char *)&lDialogString);
                      }
                      strcat(lpDialogString,"\"");
                    }
                  }
                }
              }
              else {
                iVar2 = gdialogPresent();
                if (iVar2 == 0) {
                  iVar2 = xdialogPresent();
                  if (iVar2 == 0) {
                    pcVar5 = dialogName();
                    if (pcVar5 == (char *)0x0) {
                      iVar2 = isTerminalRunning();
                      if (iVar2 == 0) {
                        if ((aTitle != (char *)0x0) &&
                           (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
                          strcpy(tinyfd_response,"whiptail");
                          return 0;
                        }
                        pcVar5 = lpDialogString;
                        bVar6 = true;
                        pcVar4 = terminalName();
                        strcpy(pcVar5,pcVar4);
                        strcat(lpDialogString,"\'(whiptail ");
                      }
                      else {
                        if ((aTitle != (char *)0x0) &&
                           (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
                          strcpy(tinyfd_response,"whiptail");
                          return 0;
                        }
                        strcpy(lpDialogString,"(whiptail ");
                      }
                    }
                    else {
                      if ((aTitle != (char *)0x0) &&
                         (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
                        strcpy(tinyfd_response,"dialog");
                        return 0;
                      }
                      iVar2 = isTerminalRunning();
                      pcVar5 = lpDialogString;
                      bVar6 = iVar2 == 0;
                      if (bVar6) {
                        pcVar4 = terminalName();
                        strcpy(pcVar5,pcVar4);
                        strcat(lpDialogString,"\'(");
                        pcVar5 = lpDialogString;
                        pcVar4 = dialogName();
                        strcat(pcVar5,pcVar4);
                        strcat(lpDialogString," ");
                      }
                      else {
                        strcpy(lpDialogString,"(dialog ");
                      }
                    }
                  }
                  else {
                    if ((aTitle != (char *)0x0) &&
                       (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
                      strcpy(tinyfd_response,"xdialog");
                      return 1;
                    }
                    bVar7 = true;
                    strcpy(lpDialogString,"(Xdialog ");
                  }
                }
                else {
                  if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)
                     ) {
                    strcpy(tinyfd_response,"gdialog");
                    return 1;
                  }
                  bVar7 = true;
                  strcpy(lpDialogString,"(gdialog ");
                }
                if ((aTitle != (char *)0x0) && (sVar3 = strlen(aTitle), sVar3 != 0)) {
                  strcat(lpDialogString,"--title \"");
                  strcat(lpDialogString,aTitle);
                  strcat(lpDialogString,"\" ");
                }
                iVar2 = xdialogPresent();
                if ((((iVar2 == 0) && (iVar2 = gdialogPresent(), iVar2 == 0)) &&
                    (aDialogType != (char *)0x0)) &&
                   (((iVar2 = strcmp("okcancel",aDialogType), iVar2 == 0 ||
                     (iVar2 = strcmp("yesno",aDialogType), iVar2 == 0)) ||
                    (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 == 0)))) {
                  strcat(lpDialogString,"--backtitle \"");
                  strcat(lpDialogString,"tab: move focus");
                  strcat(lpDialogString,"\" ");
                }
                if ((aDialogType == (char *)0x0) ||
                   (iVar2 = strcmp("okcancel",aDialogType), iVar2 != 0)) {
                  if ((aDialogType == (char *)0x0) ||
                     (iVar2 = strcmp("yesno",aDialogType), iVar2 != 0)) {
                    if ((aDialogType == (char *)0x0) ||
                       (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 != 0)) {
                      strcat(lpDialogString,"--msgbox ");
                    }
                    else {
                      if (lBuff._1020_4_ == 0) {
                        strcat(lpDialogString,"--defaultno ");
                      }
                      strcat(lpDialogString,"--menu ");
                    }
                  }
                  else {
                    if (lBuff._1020_4_ == 0) {
                      strcat(lpDialogString,"--defaultno ");
                    }
                    strcat(lpDialogString,"--yesno ");
                  }
                }
                else {
                  if (lBuff._1020_4_ == 0) {
                    strcat(lpDialogString,"--defaultno ");
                  }
                  strcat(lpDialogString,"--yes-label \"Ok\" --no-label \"Cancel\" --yesno ");
                }
                strcat(lpDialogString,"\"");
                if ((aMessage != (char *)0x0) && (sVar3 = strlen(aMessage), sVar3 != 0)) {
                  strcat(lpDialogString,aMessage);
                }
                strcat(lpDialogString,"\" ");
                if (bVar7) {
                  if ((aDialogType == (char *)0x0) ||
                     (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 != 0)) {
                    strcat(lpDialogString,"10 60 ) 2>&1;if [ $? = 0 ];then echo 1;else echo 0;fi");
                  }
                  else {
                    strcat(lpDialogString,
                           "0 60 0 Yes \"\" No \"\") 2>/tmp/tinyfd.txt;if [ $? = 0 ];then tinyfdBool=1;else tinyfdBool=0;fi;tinyfdRes=$(cat /tmp/tinyfd.txt);echo $tinyfdBool$tinyfdRes"
                          );
                  }
                }
                else if ((aDialogType == (char *)0x0) ||
                        (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 != 0)) {
                  strcat(lpDialogString,"10 60 >/dev/tty) 2>&1;if [ $? = 0 ];");
                  if (bVar6) {
                    strcat(lpDialogString,
                           "then\n\techo 1\nelse\n\techo 0\nfi >/tmp/tinyfd.txt\';cat /tmp/tinyfd.txt;rm /tmp/tinyfd.txt"
                          );
                  }
                  else {
                    strcat(lpDialogString,"then echo 1;else echo 0;fi;clear >/dev/tty");
                  }
                }
                else {
                  strcat(lpDialogString,
                         "0 60 0 Yes \"\" No \"\" >/dev/tty ) 2>/tmp/tinyfd.txt;                if [ $? = 0 ];then tinyfdBool=1;else tinyfdBool=0;fi;                tinyfdRes=$(cat /tmp/tinyfd.txt);echo $tinyfdBool$tinyfdRes"
                        );
                  if (bVar6) {
                    strcat(lpDialogString," >/tmp/tinyfd0.txt\';cat /tmp/tinyfd0.txt");
                  }
                  else {
                    strcat(lpDialogString,"; clear >/dev/tty");
                  }
                }
              }
            }
            else {
              iVar2 = gxmessagePresent();
              if (iVar2 == 0) {
                iVar2 = gmessagePresent();
                if (iVar2 == 0) {
                  if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)
                     ) {
                    strcpy(tinyfd_response,"xmessage");
                    return 1;
                  }
                  strcpy(lpDialogString,"xmessage");
                }
                else {
                  if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)
                     ) {
                    strcpy(tinyfd_response,"gmessage");
                    return 1;
                  }
                  strcpy(lpDialogString,"gmessage");
                }
              }
              else {
                if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0))
                {
                  strcpy(tinyfd_response,"gxmessage");
                  return 1;
                }
                strcpy(lpDialogString,"gxmessage");
              }
              if ((aDialogType == (char *)0x0) ||
                 (iVar2 = strcmp("okcancel",aDialogType), iVar2 != 0)) {
                if ((aDialogType == (char *)0x0) ||
                   (iVar2 = strcmp("yesno",aDialogType), iVar2 != 0)) {
                  if ((aDialogType == (char *)0x0) ||
                     (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 != 0)) {
                    strcat(lpDialogString," -buttons Ok:1");
                    strcat(lpDialogString," -default Ok");
                  }
                  else {
                    strcat(lpDialogString," -buttons Yes:1,No:2,Cancel:0");
                    if (lBuff._1020_4_ == 0) {
                      strcat(lpDialogString," -default Cancel");
                    }
                    else if (lBuff._1020_4_ == 1) {
                      strcat(lpDialogString," -default Yes");
                    }
                    else if (lBuff._1020_4_ == 2) {
                      strcat(lpDialogString," -default No");
                    }
                  }
                }
                else {
                  strcat(lpDialogString," -buttons Yes:1,No:0");
                  if (lBuff._1020_4_ == 0) {
                    strcat(lpDialogString," -default No");
                  }
                  else if (lBuff._1020_4_ == 1) {
                    strcat(lpDialogString," -default Yes");
                  }
                }
              }
              else {
                strcat(lpDialogString," -buttons Ok:1,Cancel:0");
                if (lBuff._1020_4_ == 0) {
                  strcat(lpDialogString," -default Cancel");
                }
                else if (lBuff._1020_4_ == 1) {
                  strcat(lpDialogString," -default Ok");
                }
              }
              strcat(lpDialogString," -center \"");
              if ((aMessage != (char *)0x0) && (sVar3 = strlen(aMessage), sVar3 != 0)) {
                strcat(lpDialogString,aMessage);
              }
              strcat(lpDialogString,"\"");
              if ((aTitle != (char *)0x0) && (sVar3 = strlen(aTitle), sVar3 != 0)) {
                strcat(lpDialogString," -title  \"");
                strcat(lpDialogString,aTitle);
                strcat(lpDialogString,"\"");
              }
              strcat(lpDialogString," ; echo $? ");
            }
          }
        }
      }
      else {
        iVar2 = zenityPresent();
        if (iVar2 == 0) {
          iVar2 = matedialogPresent();
          if (iVar2 == 0) {
            iVar2 = shellementaryPresent();
            if (iVar2 == 0) {
              if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
                strcpy(tinyfd_response,"qarma");
                return 1;
              }
              strcpy(lpDialogString,"szAnswer=$(qarma");
              pcVar5 = getenv("SSH_TTY");
              if (pcVar5 == (char *)0x0) {
                strcat(lpDialogString,
                       " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)");
              }
            }
            else {
              if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
                strcpy(tinyfd_response,"shellementary");
                return 1;
              }
              strcpy(lpDialogString,"szAnswer=$(shellementary");
            }
          }
          else {
            if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
              strcpy(tinyfd_response,"matedialog");
              return 1;
            }
            strcpy(lpDialogString,"szAnswer=$(matedialog");
          }
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
            strcpy(tinyfd_response,"zenity");
            return 1;
          }
          strcpy(lpDialogString,"szAnswer=$(zenity");
          iVar2 = zenity3Present();
          if ((3 < iVar2) && (pcVar5 = getenv("SSH_TTY"), pcVar5 == (char *)0x0)) {
            strcat(lpDialogString,
                   " --attach=$(sleep .01;xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)");
          }
        }
        strcat(lpDialogString," --");
        if ((aDialogType == (char *)0x0) || (iVar2 = strcmp("okcancel",aDialogType), iVar2 != 0)) {
          if ((aDialogType == (char *)0x0) || (iVar2 = strcmp("yesno",aDialogType), iVar2 != 0)) {
            if ((aDialogType == (char *)0x0) ||
               (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 != 0)) {
              if ((aIconType == (char *)0x0) || (iVar2 = strcmp("error",aIconType), iVar2 != 0)) {
                if ((aIconType == (char *)0x0) || (iVar2 = strcmp("warning",aIconType), iVar2 != 0))
                {
                  strcat(lpDialogString,"info");
                }
                else {
                  strcat(lpDialogString,"warning");
                }
              }
              else {
                strcat(lpDialogString,"error");
              }
            }
            else {
              strcat(lpDialogString,"list --column \"\" --hide-header \"Yes\" \"No\"");
            }
          }
          else {
            strcat(lpDialogString,"question");
          }
        }
        else {
          strcat(lpDialogString,"question --ok-label=Ok --cancel-label=Cancel");
        }
        if ((aTitle != (char *)0x0) && (sVar3 = strlen(aTitle), sVar3 != 0)) {
          strcat(lpDialogString," --title=\"");
          strcat(lpDialogString,aTitle);
          strcat(lpDialogString,"\"");
        }
        if ((aMessage != (char *)0x0) && (sVar3 = strlen(aMessage), sVar3 != 0)) {
          strcat(lpDialogString," --no-wrap --text=\"");
          strcat(lpDialogString,aMessage);
          strcat(lpDialogString,"\"");
        }
        iVar2 = zenity3Present();
        if ((2 < iVar2) ||
           ((iVar2 = zenityPresent(), iVar2 == 0 &&
            ((iVar2 = shellementaryPresent(), iVar2 != 0 || (iVar2 = qarmaPresent(), iVar2 != 0)))))
           ) {
          strcat(lpDialogString," --icon-name=dialog-");
          if ((aIconType == (char *)0x0) ||
             (((iVar2 = strcmp("question",aIconType), iVar2 != 0 &&
               (iVar2 = strcmp("error",aIconType), iVar2 != 0)) &&
              (iVar2 = strcmp("warning",aIconType), iVar2 != 0)))) {
            strcat(lpDialogString,"information");
          }
          else {
            strcat(lpDialogString,aIconType);
          }
        }
        if (tinyfd_silent != 0) {
          strcat(lpDialogString," 2>/dev/null ");
        }
        iVar2 = strcmp("yesnocancel",aDialogType);
        if (iVar2 == 0) {
          strcat(lpDialogString,
                 ");if [ $? = 1 ];then echo 0;elif [ $szAnswer = \"No\" ];then echo 2;else echo 1;fi"
                );
        }
        else {
          strcat(lpDialogString,");if [ $? = 0 ];then echo 1;else echo 0;fi");
        }
      }
    }
    else {
      if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
        strcpy(tinyfd_response,"kdialog");
        return 1;
      }
      strcpy(lpDialogString,"kdialog");
      iVar2 = kdialogPresent();
      if (iVar2 == 2) {
        strcat(lpDialogString," --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)")
        ;
      }
      strcat(lpDialogString," --");
      if ((aDialogType == (char *)0x0) ||
         (((iVar2 = strcmp("okcancel",aDialogType), iVar2 != 0 &&
           (iVar2 = strcmp("yesno",aDialogType), iVar2 != 0)) &&
          (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 != 0)))) {
        if ((aIconType == (char *)0x0) || (iVar2 = strcmp("error",aIconType), iVar2 != 0)) {
          if ((aIconType == (char *)0x0) || (iVar2 = strcmp("warning",aIconType), iVar2 != 0)) {
            strcat(lpDialogString,"msgbox");
          }
          else {
            strcat(lpDialogString,"sorry");
          }
        }
        else {
          strcat(lpDialogString,"error");
        }
      }
      else {
        if ((aIconType != (char *)0x0) &&
           ((iVar2 = strcmp("warning",aIconType), iVar2 == 0 ||
            (iVar2 = strcmp("error",aIconType), iVar2 == 0)))) {
          strcat(lpDialogString,"warning");
        }
        iVar2 = strcmp("yesnocancel",aDialogType);
        if (iVar2 == 0) {
          strcat(lpDialogString,"yesnocancel");
        }
        else {
          strcat(lpDialogString,"yesno");
        }
      }
      strcat(lpDialogString," \"");
      if (aMessage != (char *)0x0) {
        strcat(lpDialogString,aMessage);
      }
      strcat(lpDialogString,"\"");
      if ((aDialogType != (char *)0x0) && (iVar2 = strcmp("okcancel",aDialogType), iVar2 == 0)) {
        strcat(lpDialogString," --yes-label Ok --no-label Cancel");
      }
      if ((aTitle != (char *)0x0) && (sVar3 = strlen(aTitle), sVar3 != 0)) {
        strcat(lpDialogString," --title \"");
        strcat(lpDialogString,aTitle);
        strcat(lpDialogString,"\"");
      }
      iVar2 = strcmp("yesnocancel",aDialogType);
      if (iVar2 == 0) {
        strcat(lpDialogString,
               "; x=$? ;if [ $x = 0 ] ;then echo 1;elif [ $x = 1 ] ;then echo 2;else echo 0;fi");
      }
      else {
        strcat(lpDialogString,";if [ $? = 0 ];then echo 1;else echo 0;fi");
      }
    }
  }
  else {
    if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
      strcpy(tinyfd_response,"applescript");
      return 1;
    }
    strcpy(lpDialogString,"osascript ");
    iVar2 = osx9orBetter();
    if (iVar2 == 0) {
      strcat(lpDialogString," -e \'tell application \"System Events\"\' -e \'Activate\'");
    }
    strcat(lpDialogString,
           " -e \'try\' -e \'set {vButton} to {button returned} of ( display dialog \"");
    if ((aMessage != (char *)0x0) && (sVar3 = strlen(aMessage), sVar3 != 0)) {
      strcat(lpDialogString,aMessage);
    }
    strcat(lpDialogString,"\" ");
    if ((aTitle != (char *)0x0) && (sVar3 = strlen(aTitle), sVar3 != 0)) {
      strcat(lpDialogString,"with title \"");
      strcat(lpDialogString,aTitle);
      strcat(lpDialogString,"\" ");
    }
    strcat(lpDialogString,"with icon ");
    if ((aIconType == (char *)0x0) || (iVar2 = strcmp("error",aIconType), iVar2 != 0)) {
      if ((aIconType == (char *)0x0) || (iVar2 = strcmp("warning",aIconType), iVar2 != 0)) {
        strcat(lpDialogString,"note ");
      }
      else {
        strcat(lpDialogString,"caution ");
      }
    }
    else {
      strcat(lpDialogString,"stop ");
    }
    if ((aDialogType == (char *)0x0) || (iVar2 = strcmp("okcancel",aDialogType), iVar2 != 0)) {
      if ((aDialogType == (char *)0x0) || (iVar2 = strcmp("yesno",aDialogType), iVar2 != 0)) {
        if ((aDialogType == (char *)0x0) || (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 != 0))
        {
          strcat(lpDialogString,"buttons {\"OK\"} ");
          strcat(lpDialogString,"default button \"OK\" ");
        }
        else {
          strcat(lpDialogString,"buttons {\"No\", \"Yes\", \"Cancel\"} ");
          if (lBuff._1020_4_ == 0) {
            strcat(lpDialogString,"default button \"Cancel\" ");
          }
          else if (lBuff._1020_4_ == 1) {
            strcat(lpDialogString,"default button \"Yes\" ");
          }
          else if (lBuff._1020_4_ == 2) {
            strcat(lpDialogString,"default button \"No\" ");
          }
          strcat(lpDialogString,"cancel button \"Cancel\"");
        }
      }
      else {
        strcat(lpDialogString,"buttons {\"No\", \"Yes\"} ");
        if (lBuff._1020_4_ == 0) {
          strcat(lpDialogString,"default button \"No\" ");
        }
        else {
          strcat(lpDialogString,"default button \"Yes\" ");
        }
        strcat(lpDialogString,"cancel button \"No\"");
      }
    }
    else if (lBuff._1020_4_ == 0) {
      strcat(lpDialogString,"default button \"Cancel\" ");
    }
    strcat(lpDialogString,")\' ");
    strcat(lpDialogString,
           "-e \'if vButton is \"Yes\" then\' -e \'return 1\' -e \'else if vButton is \"OK\" then\' -e \'return 1\' -e \'else if vButton is \"No\" then\' -e \'return 2\' -e \'else\' -e \'return 0\' -e \'end if\' "
          );
    strcat(lpDialogString,"-e \'on error number -128\' ");
    strcat(lpDialogString,"-e \'0\' ");
    strcat(lpDialogString,"-e \'end try\'");
    iVar2 = osx9orBetter();
    if (iVar2 == 0) {
      strcat(lpDialogString," -e \'end tell\'");
    }
  }
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",lpDialogString);
  }
  __stream = popen(lpDialogString,"r");
  if (__stream == (FILE *)0x0) {
    free(lpDialogString);
    aTitle_local._4_4_ = 0;
  }
  else {
    do {
      pcVar5 = fgets((char *)&lDialogString,0x400,__stream);
    } while (pcVar5 != (char *)0x0);
    pclose(__stream);
    sVar3 = strlen((char *)&lDialogString);
    if (*(char *)((long)&lpDialogString + sVar3 + 7) == '\n') {
      sVar3 = strlen((char *)&lDialogString);
      *(undefined1 *)((long)&lpDialogString + sVar3 + 7) = 0;
    }
    if (((aDialogType != (char *)0x0) && (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 == 0)) &&
       ((char)lDialogString == '1')) {
      iVar2 = strcmp((char *)((long)&lDialogString + 1),"Yes");
      if (iVar2 == 0) {
        strcpy((char *)&lDialogString,"1");
      }
      else {
        iVar2 = strcmp((char *)((long)&lDialogString + 1),"No");
        if (iVar2 == 0) {
          strcpy((char *)&lDialogString,"2");
        }
      }
    }
    iVar2 = strcmp((char *)&lDialogString,"2");
    if (iVar2 == 0) {
      local_58c = 2;
    }
    else {
      iVar2 = strcmp((char *)&lDialogString,"1");
      local_58c = (uint)(iVar2 == 0);
    }
    free(lpDialogString);
    aTitle_local._4_4_ = local_58c;
  }
  return aTitle_local._4_4_;
}

Assistant:

int tinyfd_messageBox(
        char const * const aTitle , /* NULL or "" */
        char const * const aMessage , /* NULL or ""  may contain \n and \t */
        char const * const aDialogType , /* "ok" "okcancel" "yesno" "yesnocancel" */
        char const * const aIconType , /* "info" "warning" "error" "question" */
        int const aDefaultButton ) /* 0 for cancel/no , 1 for ok/yes , 2 for no in yesnocancel */
{
        char lChar ;

#ifndef TINYFD_NOLIB
        if ((!tinyfd_forceConsole || !(GetConsoleWindow() || dialogPresent()))
                && (!getenv("SSH_CLIENT") || getenv("DISPLAY")))
        {
                if (aTitle&&!strcmp(aTitle, "tinyfd_query")){ strcpy(tinyfd_response, "windows"); return 1; }
                if (tinyfd_winUtf8)
                {
                        return messageBoxWinGui8(
                                aTitle, aMessage, aDialogType, aIconType, aDefaultButton);
                }
                else
                {
                        return messageBoxWinGuiA(
                                aTitle, aMessage, aDialogType, aIconType, aDefaultButton);
                }
        }
        else
#endif /* TINYFD_NOLIB */
        if ( dialogPresent() )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"dialog");return 0;}
                return messageBoxWinConsole(
                                        aTitle,aMessage,aDialogType,aIconType,aDefaultButton);
        }
        else
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"basicinput");return 0;}
                if (!gWarningDisplayed && !tinyfd_forceConsole )
                {
                        gWarningDisplayed = 1; 
                        printf("\n\n%s\n", gTitle);
                        printf("%s\n\n", tinyfd_needs);
                }
                if ( aTitle && strlen(aTitle) )
                {
                        printf("\n%s\n\n", aTitle);
                }
                if ( aDialogType && !strcmp("yesno",aDialogType) )
                {
                        do
                        {
                                if ( aMessage && strlen(aMessage) )
                                {
                                        printf("%s\n",aMessage);
                                }
                                printf("y/n: ");
                                lChar = (char) tolower( _getch() ) ;
                                printf("\n\n");
                        }
                        while ( lChar != 'y' && lChar != 'n' ) ;
                        return lChar == 'y' ? 1 : 0 ;
                }
                else if ( aDialogType && !strcmp("okcancel",aDialogType) )
                {
                        do
                        {
                                if ( aMessage && strlen(aMessage) )
                                {
                                        printf("%s\n",aMessage);
                                }
                                printf("[O]kay/[C]ancel: ");
                                lChar = (char) tolower( _getch() ) ;
                                printf("\n\n");
                        }
                        while ( lChar != 'o' && lChar != 'c' ) ;
                        return lChar == 'o' ? 1 : 0 ;
                }
                else if (aDialogType && !strcmp("yesnocancel", aDialogType))
                {
                        do
                        {
                                if (aMessage && strlen(aMessage))
                                {
                                        printf("%s\n", aMessage);
                                }
                                printf("[Y]es/[N]o/[C]ancel: ");
                                lChar = (char)tolower(_getch());
                                printf("\n\n");
                        } while (lChar != 'y' && lChar != 'n' && lChar != 'c');
                        return (lChar == 'y') ? 1 : (lChar == 'n') ? 2 : 0 ;
                }
                else
                {
                        if ( aMessage && strlen(aMessage) )
                        {
                                printf("%s\n\n",aMessage);
                        }
                        printf("press enter to continue ");
                        lChar = (char) _getch() ;
                        printf("\n\n");
                        return 1 ;
                }
        }
}